

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

page_collection *
page_collection_lock_tricore(uc_struct_conflict15 *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  ulong uVar1;
  page_collection *set;
  GTree *pGVar2;
  PageDesc *pPVar3;
  ulong uVar4;
  ulong index;
  
  set = (page_collection *)g_malloc(0x10);
  index = start >> 0xe;
  if (index <= end >> 0xe) {
    pGVar2 = g_tree_new_full(tb_page_addr_cmp,(gpointer)0x0,(GDestroyNotify)0x0,page_entry_destroy);
    set->tree = pGVar2;
    set->max = (page_entry *)0x0;
    for (; index <= end >> 0xe; index = index + 1) {
      pPVar3 = page_find(uc,index);
      if (pPVar3 != (PageDesc *)0x0) {
        page_trylock_add(uc,set,index << 0xe);
        while( true ) {
          uVar1 = pPVar3->first_tb;
          uVar4 = uVar1 & 0xfffffffffffffffe;
          if (uVar4 == 0) break;
          page_trylock_add(uc,set,*(tb_page_addr_t *)(uVar4 + 0x40));
          if (*(tb_page_addr_t *)(uVar4 + 0x48) != 0xffffffffffffffff) {
            page_trylock_add(uc,set,*(tb_page_addr_t *)(uVar4 + 0x48));
          }
          pPVar3 = (PageDesc *)((ulong)((uint)uVar1 & 1) * 8 + 0x30 + uVar4);
        }
      }
    }
    return set;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
             ,0x293,"start <= end");
}

Assistant:

struct page_collection *
page_collection_lock(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *set = g_malloc(sizeof(*set));
    tb_page_addr_t index;
    PageDesc *pd;

    start >>= TARGET_PAGE_BITS;
    end   >>= TARGET_PAGE_BITS;
    g_assert(start <= end);

    set->tree = g_tree_new_full(tb_page_addr_cmp, NULL, NULL,
                                page_entry_destroy);
    set->max = NULL;
    assert_no_pages_locked();

 retry:
#if 0
    g_tree_foreach(set->tree, page_entry_lock, NULL);
#endif

    for (index = start; index <= end; index++) {
        TranslationBlock *tb;
        int n;

        pd = page_find(uc, index);
        if (pd == NULL) {
            continue;
        }
        if (page_trylock_add(uc, set, index << TARGET_PAGE_BITS)) {
#if 0
            g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
            goto retry;
        }
        assert_page_locked(pd);
        PAGE_FOR_EACH_TB(pd, tb, n) {
            if (page_trylock_add(uc, set, tb->page_addr[0]) ||
                (tb->page_addr[1] != -1 &&
                 page_trylock_add(uc, set, tb->page_addr[1]))) {
                /* drop all locks, and reacquire in order */
#if 0
                g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
                goto retry;
            }
        }
    }
    return set;
}